

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_list.hpp
# Opt level: O3

bool __thiscall
libtorrent::aux::torrent_list<libtorrent::aux::torrent>::erase
          (torrent_list<libtorrent::aux::torrent> *this,info_hash_t *ih)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  torrent *ptVar3;
  __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
  _Var4;
  pointer psVar5;
  anon_class_16_2_f7cad86f f;
  torrent *found;
  torrent *local_18;
  
  local_18 = (torrent *)0x0;
  f.found = &local_18;
  f.this = this;
  info_hash_t::
  for_each<libtorrent::aux::torrent_list<libtorrent::aux::torrent>::erase(libtorrent::info_hash_t_const&)::_lambda(libtorrent::digest32<160l>const&,libtorrent::protocol_version)_1_>
            (ih,f);
  ptVar3 = local_18;
  if (local_18 != (torrent *)0x0) {
    _Var4 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>*,std::vector<std::shared_ptr<libtorrent::aux::torrent>,std::allocator<std::shared_ptr<libtorrent::aux::torrent>>>>,__gnu_cxx::__ops::_Iter_pred<libtorrent::aux::torrent_list<libtorrent::aux::torrent>::erase(libtorrent::info_hash_t_const&)::_lambda(std::shared_ptr<libtorrent::aux::torrent>const&)_1_>>
                      ((this->m_array).
                       super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->m_array).
                       super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_18);
    psVar5 = (this->m_array).
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (_Var4._M_current != psVar5 + -1) {
      peVar1 = ((_Var4._M_current)->
               super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      ((_Var4._M_current)->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)
      ._M_ptr = psVar5[-1].super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      psVar5[-1].super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar1;
      p_Var2 = psVar5[-1].super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      psVar5[-1].super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           ((_Var4._M_current)->
           super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      ((_Var4._M_current)->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)
      ._M_refcount._M_pi = p_Var2;
      psVar5 = (this->m_array).
               super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    (this->m_array).
    super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar5 + -1;
    p_Var2 = psVar5[-1].super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  return ptVar3 != (torrent *)0x0;
}

Assistant:

bool erase(info_hash_t const& ih)
	{
		INVARIANT_CHECK;

		T* found = nullptr;
		ih.for_each([&](sha1_hash const& hash, protocol_version)
		{
			auto const i = m_index.find(hash);
			if (i != m_index.end())
			{
				TORRENT_ASSERT(found == nullptr || found == i->second);
				found = i->second;
				m_index.erase(i);
			}

#if !defined TORRENT_DISABLE_ENCRYPTION
			static char const req2[4] = { 'r', 'e', 'q', '2' };
			hasher h(req2);
			h.update(hash);
			m_obfuscated_index.erase(h.final());
#endif
		});
		if (!found) return false;

		auto const array_iter = std::find_if(m_array.begin(), m_array.end()
			, [&](std::shared_ptr<T> const& p) { return p.get() == found; });
		TORRENT_ASSERT(array_iter != m_array.end());

		TORRENT_ASSERT(m_index.find(ih.v1) == m_index.end());

		if (array_iter != m_array.end() - 1)
			std::swap(*array_iter, m_array.back());

		// This is where we, potentially, remove the last reference
		m_array.pop_back();

		return true;
	}